

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack16to4.h
# Opt level: O0

void ncnn::deconvolution_pack16to4_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  int iVar120;
  int iVar121;
  undefined8 *puVar122;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 in_ZMM16 [64];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _wf;
  __m128 _we;
  __m128 _wd;
  __m128 _wc;
  __m128 _wb;
  __m128 _wa;
  __m128 _w9;
  __m128 _w8;
  __m128 _w7;
  __m128 _w6;
  __m128 _w5;
  __m128 _w4;
  __m128 _w3;
  __m128 _w2;
  __m128 _w1;
  __m128 _w0;
  __m128 _valf;
  __m128 _vale;
  __m128 _vald;
  __m128 _valc;
  __m128 _valb;
  __m128 _vala;
  __m128 _val9;
  __m128 _val8;
  __m128 _val7;
  __m128 _val6;
  __m128 _val5;
  __m128 _val4;
  __m128 _val3;
  __m128 _val2;
  __m128 _val1;
  __m128 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y_1;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_3;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  undefined8 local_2cb8;
  undefined8 uStack_2cb0;
  int local_2728;
  int local_271c;
  int local_26cc;
  long local_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  int local_2664;
  int local_2660;
  undefined8 *local_25f0;
  int local_25e4;
  undefined1 local_1d38 [8];
  undefined8 uStack_1d30;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  float local_1958;
  float fStack_1954;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1900;
  float fStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  float local_1668;
  float fStack_1664;
  float fStack_1660;
  float fStack_165c;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float local_1608;
  float fStack_1604;
  float fStack_1600;
  float fStack_15fc;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float local_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float local_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  
  lVar116 = in_RSI[7];
  lVar5 = *in_RCX;
  for (local_25e4 = 0; local_25e4 < (int)lVar116; local_25e4 = local_25e4 + 1) {
    local_25f0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_25e4 * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    lVar117 = in_RDI[6];
    lVar118 = in_RDI[7];
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar119 = in_RSI[6];
    for (local_2660 = 0; local_2660 < (int)lVar119; local_2660 = local_2660 + 1) {
      for (local_2664 = 0; local_2664 < iVar4; local_2664 = local_2664 + 1) {
        local_2678 = 0;
        uStack_2670 = 0;
        if (lVar5 != 0) {
          puVar122 = (undefined8 *)(lVar5 + (long)(local_25e4 << 2) * 4);
          local_2678 = *puVar122;
          uStack_2670 = puVar122[1];
        }
        local_2680 = *in_RDX + in_RDX[8] * (long)local_25e4 * in_RDX[2];
        for (local_26cc = 0; local_26cc < (int)lVar118; local_26cc = local_26cc + 1) {
          for (local_271c = 0; local_271c < in_R9D; local_271c = local_271c + 1) {
            iVar120 = (local_2660 + local_271c * in_stack_00000010) -
                      in_stack_00000010 * (in_R9D + -1);
            if (((-1 < iVar120) && (iVar120 % in_stack_00000020 == 0)) &&
               (iVar120 / in_stack_00000020 < (int)lVar117)) {
              for (local_2728 = 0; local_2728 < in_R8D; local_2728 = local_2728 + 1) {
                iVar121 = (local_2664 + local_2728 * in_stack_00000008) -
                          in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar121) && (iVar121 % in_stack_00000018 == 0)) &&
                   (iVar121 / in_stack_00000018 < iVar3)) {
                  puVar1 = (undefined4 *)
                           (*in_RDI + in_RDI[8] * (long)local_26cc * in_RDI[2] +
                            (long)*(int *)((long)in_RDI + 0x2c) *
                            (long)(iVar120 / in_stack_00000020) * in_RDI[2] +
                           (long)(iVar121 / in_stack_00000018 << 4) * 4);
                  iVar121 = (local_271c * in_R8D + local_2728) * 0x40;
                  uVar2 = *puVar1;
                  auVar18._4_4_ = uVar2;
                  auVar18._0_4_ = uVar2;
                  auVar18._12_4_ = uVar2;
                  auVar18._8_4_ = uVar2;
                  uVar2 = puVar1[1];
                  auVar17._4_4_ = uVar2;
                  auVar17._0_4_ = uVar2;
                  auVar17._12_4_ = uVar2;
                  auVar17._8_4_ = uVar2;
                  uVar2 = puVar1[2];
                  auVar16._4_4_ = uVar2;
                  auVar16._0_4_ = uVar2;
                  auVar16._12_4_ = uVar2;
                  auVar16._8_4_ = uVar2;
                  uVar2 = puVar1[3];
                  auVar15._4_4_ = uVar2;
                  auVar15._0_4_ = uVar2;
                  auVar15._12_4_ = uVar2;
                  auVar15._8_4_ = uVar2;
                  uVar2 = puVar1[4];
                  auVar14._4_4_ = uVar2;
                  auVar14._0_4_ = uVar2;
                  auVar14._12_4_ = uVar2;
                  auVar14._8_4_ = uVar2;
                  uVar2 = puVar1[5];
                  auVar13._4_4_ = uVar2;
                  auVar13._0_4_ = uVar2;
                  auVar13._12_4_ = uVar2;
                  auVar13._8_4_ = uVar2;
                  uVar2 = puVar1[6];
                  auVar12._4_4_ = uVar2;
                  auVar12._0_4_ = uVar2;
                  auVar12._12_4_ = uVar2;
                  auVar12._8_4_ = uVar2;
                  uVar2 = puVar1[7];
                  auVar11._4_4_ = uVar2;
                  auVar11._0_4_ = uVar2;
                  auVar11._12_4_ = uVar2;
                  auVar11._8_4_ = uVar2;
                  uVar2 = puVar1[8];
                  auVar10._4_4_ = uVar2;
                  auVar10._0_4_ = uVar2;
                  auVar10._12_4_ = uVar2;
                  auVar10._8_4_ = uVar2;
                  uVar2 = puVar1[9];
                  auVar9._4_4_ = uVar2;
                  auVar9._0_4_ = uVar2;
                  auVar9._12_4_ = uVar2;
                  auVar9._8_4_ = uVar2;
                  uVar2 = puVar1[10];
                  auVar8._4_4_ = uVar2;
                  auVar8._0_4_ = uVar2;
                  auVar8._12_4_ = uVar2;
                  auVar8._8_4_ = uVar2;
                  uVar2 = puVar1[0xb];
                  auVar7._4_4_ = uVar2;
                  auVar7._0_4_ = uVar2;
                  auVar7._12_4_ = uVar2;
                  auVar7._8_4_ = uVar2;
                  uVar2 = puVar1[0xc];
                  auVar123._4_4_ = uVar2;
                  auVar123._0_4_ = uVar2;
                  auVar123._12_4_ = uVar2;
                  auVar123._8_4_ = uVar2;
                  uVar2 = puVar1[0xd];
                  auVar6._4_4_ = uVar2;
                  auVar6._0_4_ = uVar2;
                  auVar6._12_4_ = uVar2;
                  auVar6._8_4_ = uVar2;
                  uVar2 = puVar1[0xe];
                  auVar125._4_4_ = uVar2;
                  auVar125._0_4_ = uVar2;
                  auVar125._12_4_ = uVar2;
                  auVar125._8_4_ = uVar2;
                  uVar2 = puVar1[0xf];
                  auVar124._4_4_ = uVar2;
                  auVar124._0_4_ = uVar2;
                  auVar124._12_4_ = uVar2;
                  auVar124._8_4_ = uVar2;
                  auVar126._8_8_ = uStack_2670;
                  auVar126._0_8_ = local_2678;
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])(local_2680 + (long)iVar121 * 4),
                                             auVar18,auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x10),auVar17,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x20),auVar16,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x30),auVar15,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x40),auVar14,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x50),auVar13,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x60),auVar12,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x70),auVar11,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x80),auVar10,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0x90),auVar9,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xa0),auVar8,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xb0),auVar7,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xc0),auVar123,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xd0),auVar6,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xe0),auVar125,
                                             auVar126);
                  auVar126 = vfmadd213ps_fma(*(undefined1 (*) [16])
                                              (local_2680 + (long)iVar121 * 4 + 0xf0),auVar124,
                                             auVar126);
                  local_2cb8 = auVar126._0_8_;
                  uStack_2cb0 = auVar126._8_8_;
                  local_2678 = local_2cb8;
                  uStack_2670 = uStack_2cb0;
                }
              }
            }
          }
          local_2680 = local_2680 + (long)(in_R8D * in_R9D * 0x40) * 4;
        }
        fStack_1900 = (float)uStack_2670;
        fStack_18fc = (float)((ulong)uStack_2670 >> 0x20);
        local_1958 = (float)local_2678;
        fStack_1954 = (float)((ulong)local_2678 >> 0x20);
        switch(in_stack_00000028) {
        case 1:
          auVar19._8_8_ = uStack_2670;
          auVar19._0_8_ = local_2678;
          _local_1d38 = vmaxps_avx(auVar19,ZEXT816(0));
          break;
        case 2:
          fVar127 = *(float *)*in_stack_00000030;
          auVar22._8_8_ = uStack_2670;
          auVar22._0_8_ = local_2678;
          auVar126 = vmaxps_avx(ZEXT816(0),auVar22);
          auVar23._8_8_ = uStack_2670;
          auVar23._0_8_ = local_2678;
          auVar124 = vminps_avx(ZEXT816(0),auVar23);
          local_18f8 = auVar124._0_4_;
          fStack_18f4 = auVar124._4_4_;
          fStack_18f0 = auVar124._8_4_;
          fStack_18ec = auVar124._12_4_;
          local_1968 = auVar126._0_4_;
          fStack_1964 = auVar126._4_4_;
          fStack_1960 = auVar126._8_4_;
          fStack_195c = auVar126._12_4_;
          local_1d38._4_4_ = fStack_1964 + fVar127 * fStack_18f4;
          local_1d38._0_4_ = local_1968 + fVar127 * local_18f8;
          uStack_1d30._0_4_ = fStack_1960 + fVar127 * fStack_18f0;
          uStack_1d30._4_4_ = fStack_195c + fVar127 * fStack_18ec;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000030;
          auVar20._4_4_ = uVar2;
          auVar20._0_4_ = uVar2;
          auVar20._12_4_ = uVar2;
          auVar20._8_4_ = uVar2;
          uVar2 = *(undefined4 *)(*in_stack_00000030 + 4);
          auVar24._4_4_ = uVar2;
          auVar24._0_4_ = uVar2;
          auVar24._12_4_ = uVar2;
          auVar24._8_4_ = uVar2;
          auVar21._8_8_ = uStack_2670;
          auVar21._0_8_ = local_2678;
          auVar126 = vmaxps_avx(auVar21,auVar20);
          _local_1d38 = vminps_avx(auVar126,auVar24);
          break;
        case 4:
          auVar25._8_8_ = 0x3f8000003f800000;
          auVar25._0_8_ = 0x3f8000003f800000;
          auVar34._8_8_ = uStack_2670;
          auVar34._0_8_ = local_2678;
          auVar126 = vsubps_avx(ZEXT816(0),auVar34);
          auVar33._8_4_ = 0x42b0c0a5;
          auVar33._0_8_ = 0x42b0c0a542b0c0a5;
          auVar33._12_4_ = 0x42b0c0a5;
          auVar126 = vminps_avx(auVar126,auVar33);
          auVar32._8_4_ = 0xc2b0c0a5;
          auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar32._12_4_ = 0xc2b0c0a5;
          auVar125 = vmaxps_avx(auVar126,auVar32);
          local_15e8 = auVar125._0_4_;
          fStack_15e4 = auVar125._4_4_;
          fStack_15e0 = auVar125._8_4_;
          fStack_15dc = auVar125._12_4_;
          fVar127 = local_15e8 * 1.442695 + 0.5;
          fVar128 = fStack_15e4 * 1.442695 + 0.5;
          fVar129 = fStack_15e0 * 1.442695 + 0.5;
          fVar130 = fStack_15dc * 1.442695 + 0.5;
          local_16f8 = CONCAT44(fVar128,fVar127);
          uStack_16f0._0_4_ = fVar129;
          uStack_16f0._4_4_ = fVar130;
          local_1708 = CONCAT44((int)fVar128,(int)fVar127);
          uStack_1700._0_4_ = (int)fVar129;
          uStack_1700._4_4_ = (int)fVar130;
          auVar35._8_8_ = uStack_1700;
          auVar35._0_8_ = local_1708;
          auVar124 = vcvtdq2ps_avx(auVar35);
          auVar37._8_8_ = uStack_16f0;
          auVar37._0_8_ = local_16f8;
          auVar126 = vcmpps_avx(auVar37,auVar124,1);
          auVar39._8_8_ = 0x3f8000003f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar126 = vpand_avx(auVar126,auVar39);
          auVar126 = vsubps_avx(auVar124,auVar126);
          auVar61._8_8_ = 0x3f3180003f318000;
          auVar61._0_8_ = 0x3f3180003f318000;
          auVar124 = vfnmadd213ps_fma(auVar61,auVar126,auVar125);
          auVar62._8_8_ = 0xb95e8083b95e8083;
          auVar62._0_8_ = 0xb95e8083b95e8083;
          auVar125 = vfnmadd213ps_fma(auVar62,auVar126,auVar124);
          local_1608 = auVar125._0_4_;
          fStack_1604 = auVar125._4_4_;
          fStack_1600 = auVar125._8_4_;
          fStack_15fc = auVar125._12_4_;
          local_16e8 = CONCAT44(fStack_1604 * fStack_1604,local_1608 * local_1608);
          uStack_16e0._0_4_ = fStack_1600 * fStack_1600;
          uStack_16e0._4_4_ = fStack_15fc * fStack_15fc;
          uStack_1730._0_4_ = 0x39506967;
          local_1738 = 0x3950696739506967;
          uStack_1730._4_4_ = 0x39506967;
          auVar47._8_8_ = uStack_1730;
          auVar47._0_8_ = 0x3950696739506967;
          auVar46._8_8_ = 0x3ab743ce3ab743ce;
          auVar46._0_8_ = 0x3ab743ce3ab743ce;
          auVar124 = vfmadd213ps_fma(auVar125,auVar47,auVar46);
          auVar45._8_8_ = 0x3c0889083c088908;
          auVar45._0_8_ = 0x3c0889083c088908;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar45);
          auVar44._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar44._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar44);
          auVar43._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar43._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar43);
          auVar42._8_8_ = 0x3f0000003f000000;
          auVar42._0_8_ = 0x3f0000003f000000;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar42);
          auVar41._8_8_ = uStack_16e0;
          auVar41._0_8_ = local_16e8;
          auVar124 = vfmadd213ps_fma(auVar41,auVar124,auVar125);
          local_1668 = auVar124._0_4_;
          fStack_1664 = auVar124._4_4_;
          fStack_1660 = auVar124._8_4_;
          fStack_165c = auVar124._12_4_;
          local_1578 = auVar126._0_4_;
          fStack_1574 = auVar126._4_4_;
          fStack_1570 = auVar126._8_4_;
          fStack_156c = auVar126._12_4_;
          local_1708 = CONCAT44((int)fStack_1574,(int)local_1578);
          uStack_1700._0_4_ = (int)fStack_1570;
          uStack_1700._4_4_ = (int)fStack_156c;
          auVar56._8_8_ = uStack_1700;
          auVar56._0_8_ = local_1708;
          auVar55._8_8_ = 0x7f0000007f;
          auVar55._0_8_ = 0x7f0000007f;
          auVar126 = vpaddd_avx(auVar56,auVar55);
          auVar126 = vpslld_avx(auVar126,ZEXT416(0x17));
          local_1638 = auVar126._0_4_;
          fStack_1634 = auVar126._4_4_;
          fStack_1630 = auVar126._8_4_;
          fStack_162c = auVar126._12_4_;
          auVar28._4_4_ = (fStack_1664 + 1.0) * fStack_1634 + 1.0;
          auVar28._0_4_ = (local_1668 + 1.0) * local_1638 + 1.0;
          auVar28._8_4_ = (fStack_1660 + 1.0) * fStack_1630 + 1.0;
          auVar28._12_4_ = (fStack_165c + 1.0) * fStack_162c + 1.0;
          _local_1d38 = vdivps_avx(auVar25,auVar28);
          break;
        case 5:
          auVar123 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar31._8_8_ = uStack_2670;
          auVar31._0_8_ = local_2678;
          auVar30._8_4_ = 0x42b0c0a5;
          auVar30._0_8_ = 0x42b0c0a542b0c0a5;
          auVar30._12_4_ = 0x42b0c0a5;
          auVar126 = vminps_avx(auVar31,auVar30);
          auVar29._8_4_ = 0xc2b0c0a5;
          auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar29._12_4_ = 0xc2b0c0a5;
          auVar125 = vmaxps_avx(auVar126,auVar29);
          local_1758 = auVar125._0_4_;
          fStack_1754 = auVar125._4_4_;
          fStack_1750 = auVar125._8_4_;
          fStack_174c = auVar125._12_4_;
          fVar127 = local_1758 * 1.442695 + 0.5;
          fVar128 = fStack_1754 * 1.442695 + 0.5;
          fVar129 = fStack_1750 * 1.442695 + 0.5;
          fVar130 = fStack_174c * 1.442695 + 0.5;
          local_1868 = CONCAT44(fVar128,fVar127);
          uStack_1860._0_4_ = fVar129;
          uStack_1860._4_4_ = fVar130;
          local_1878 = CONCAT44((int)fVar128,(int)fVar127);
          uStack_1870._0_4_ = (int)fVar129;
          uStack_1870._4_4_ = (int)fVar130;
          auVar36._8_8_ = uStack_1870;
          auVar36._0_8_ = local_1878;
          auVar124 = vcvtdq2ps_avx(auVar36);
          auVar38._8_8_ = uStack_1860;
          auVar38._0_8_ = local_1868;
          auVar126 = vcmpps_avx(auVar38,auVar124,1);
          auVar40._8_8_ = 0x3f8000003f800000;
          auVar40._0_8_ = 0x3f8000003f800000;
          auVar126 = vpand_avx(auVar126,auVar40);
          auVar126 = vsubps_avx(auVar124,auVar126);
          auVar59._8_8_ = 0x3f3180003f318000;
          auVar59._0_8_ = 0x3f3180003f318000;
          auVar124 = vfnmadd213ps_fma(auVar59,auVar126,auVar125);
          auVar60._8_8_ = 0xb95e8083b95e8083;
          auVar60._0_8_ = 0xb95e8083b95e8083;
          auVar125 = vfnmadd213ps_fma(auVar60,auVar126,auVar124);
          local_1778 = auVar125._0_4_;
          fStack_1774 = auVar125._4_4_;
          fStack_1770 = auVar125._8_4_;
          fStack_176c = auVar125._12_4_;
          local_1858 = CONCAT44(fStack_1774 * fStack_1774,local_1778 * local_1778);
          uStack_1850._0_4_ = fStack_1770 * fStack_1770;
          uStack_1850._4_4_ = fStack_176c * fStack_176c;
          uStack_18a0._0_4_ = 0x39506967;
          local_18a8 = 0x3950696739506967;
          uStack_18a0._4_4_ = 0x39506967;
          auVar54._8_8_ = uStack_18a0;
          auVar54._0_8_ = 0x3950696739506967;
          auVar53._8_8_ = 0x3ab743ce3ab743ce;
          auVar53._0_8_ = 0x3ab743ce3ab743ce;
          auVar124 = vfmadd213ps_fma(auVar125,auVar54,auVar53);
          auVar52._8_8_ = 0x3c0889083c088908;
          auVar52._0_8_ = 0x3c0889083c088908;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar52);
          auVar51._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar51);
          auVar50._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar50);
          auVar49._8_8_ = 0x3f0000003f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar49);
          auVar48._8_8_ = uStack_1850;
          auVar48._0_8_ = local_1858;
          auVar124 = vfmadd213ps_fma(auVar48,auVar124,auVar125);
          local_17d8 = auVar124._0_4_;
          fStack_17d4 = auVar124._4_4_;
          fStack_17d0 = auVar124._8_4_;
          fStack_17cc = auVar124._12_4_;
          local_1558 = auVar126._0_4_;
          fStack_1554 = auVar126._4_4_;
          fStack_1550 = auVar126._8_4_;
          fStack_154c = auVar126._12_4_;
          local_1878 = CONCAT44((int)fStack_1554,(int)local_1558);
          uStack_1870._0_4_ = (int)fStack_1550;
          uStack_1870._4_4_ = (int)fStack_154c;
          auVar58._8_8_ = uStack_1870;
          auVar58._0_8_ = local_1878;
          auVar57._8_8_ = 0x7f0000007f;
          auVar57._0_8_ = 0x7f0000007f;
          auVar126 = vpaddd_avx(auVar58,auVar57);
          auVar126 = vpslld_avx(auVar126,ZEXT416(0x17));
          local_17a8 = auVar126._0_4_;
          fStack_17a4 = auVar126._4_4_;
          fStack_17a0 = auVar126._8_4_;
          fStack_179c = auVar126._12_4_;
          local_6a8 = CONCAT44((fStack_17d4 + 1.0) * fStack_17a4 + 1.0,
                               (local_17d8 + 1.0) * local_17a8 + 1.0);
          uStack_6a0._0_4_ = (fStack_17d0 + 1.0) * fStack_17a0 + 1.0;
          uStack_6a0._4_4_ = (fStack_17cc + 1.0) * fStack_179c + 1.0;
          auVar112._8_8_ = uStack_6a0;
          auVar112._0_8_ = local_6a8;
          auVar126 = vcmpps_avx(auVar112,auVar123,2);
          auVar84._8_8_ = uStack_6a0;
          auVar84._0_8_ = local_6a8;
          auVar83._8_4_ = 0x800000;
          auVar83._0_8_ = 0x80000000800000;
          auVar83._12_4_ = 0x800000;
          auVar124 = vmaxps_avx(auVar84,auVar83);
          auVar125 = vpsrld_avx(auVar124,ZEXT416(0x17));
          auVar88._8_4_ = 0x807fffff;
          auVar88._0_8_ = 0x807fffff807fffff;
          auVar88._12_4_ = 0x807fffff;
          auVar124 = vpand_avx(auVar124,auVar88);
          auVar113._8_4_ = 0x3f000000;
          auVar113._0_8_ = 0x3f0000003f000000;
          auVar113._12_4_ = 0x3f000000;
          auVar6 = vpor_avx(auVar124,auVar113);
          auVar114._8_8_ = 0x7f0000007f;
          auVar114._0_8_ = 0x7f0000007f;
          auVar124 = vpsubd_avx(auVar125,auVar114);
          auVar124 = vcvtdq2ps_avx(auVar124);
          local_618 = auVar124._0_4_;
          fStack_614 = auVar124._4_4_;
          fStack_610 = auVar124._8_4_;
          fStack_60c = auVar124._12_4_;
          local_6e8 = CONCAT44(fStack_614 + 1.0,local_618 + 1.0);
          uStack_6e0._0_4_ = fStack_610 + 1.0;
          uStack_6e0._4_4_ = fStack_60c + 1.0;
          auVar115._8_4_ = 0x3f3504f3;
          auVar115._0_8_ = 0x3f3504f33f3504f3;
          auVar115._12_4_ = 0x3f3504f3;
          auVar124 = vcmpps_avx(auVar6,auVar115,1);
          auVar125 = vpand_avx(auVar6,auVar124);
          auVar86._8_8_ = 0x3f8000003f800000;
          auVar86._0_8_ = 0x3f8000003f800000;
          auVar6 = vsubps_avx(auVar6,auVar86);
          auVar87._8_8_ = 0x3f8000003f800000;
          auVar87._0_8_ = 0x3f8000003f800000;
          auVar124 = vmovdqa64_avx512vl(auVar124);
          auVar124 = vpandd_avx512vl(auVar87,auVar124);
          auVar85._8_8_ = uStack_6e0;
          auVar85._0_8_ = local_6e8;
          auVar124 = vsubps_avx(auVar85,auVar124);
          local_638 = auVar6._0_4_;
          fStack_634 = auVar6._4_4_;
          fStack_630 = auVar6._8_4_;
          fStack_62c = auVar6._12_4_;
          local_648 = auVar125._0_4_;
          fStack_644 = auVar125._4_4_;
          fStack_640 = auVar125._8_4_;
          fStack_63c = auVar125._12_4_;
          local_638 = local_638 + local_648;
          fStack_634 = fStack_634 + fStack_644;
          fStack_630 = fStack_630 + fStack_640;
          fStack_62c = fStack_62c + fStack_63c;
          local_6a8 = CONCAT44(fStack_634,local_638);
          uStack_6a0._0_4_ = fStack_630;
          uStack_6a0._4_4_ = fStack_62c;
          uStack_720._0_4_ = 0x3d9021bb;
          local_728 = 0x3d9021bb3d9021bb;
          uStack_720._4_4_ = 0x3d9021bb;
          auVar109._8_8_ = uStack_720;
          auVar109._0_8_ = 0x3d9021bb3d9021bb;
          auVar108._8_8_ = uStack_6a0;
          auVar108._0_8_ = local_6a8;
          auVar107._8_8_ = 0xbdebd1b8bdebd1b8;
          auVar107._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar125 = vfmadd213ps_avx512vl(auVar108,auVar109,auVar107);
          auVar106._8_8_ = uStack_6a0;
          auVar106._0_8_ = local_6a8;
          auVar105._8_8_ = 0x3def251a3def251a;
          auVar105._0_8_ = 0x3def251a3def251a;
          auVar125 = vfmadd213ps_avx512vl(auVar106,auVar125,auVar105);
          auVar104._8_8_ = uStack_6a0;
          auVar104._0_8_ = local_6a8;
          auVar103._8_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar103._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar125 = vfmadd213ps_avx512vl(auVar104,auVar125,auVar103);
          auVar102._8_8_ = uStack_6a0;
          auVar102._0_8_ = local_6a8;
          auVar101._8_8_ = 0x3e11e9bf3e11e9bf;
          auVar101._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar125 = vfmadd213ps_avx512vl(auVar102,auVar125,auVar101);
          auVar100._8_8_ = uStack_6a0;
          auVar100._0_8_ = local_6a8;
          auVar99._8_8_ = 0xbe2aae50be2aae50;
          auVar99._0_8_ = 0xbe2aae50be2aae50;
          auVar125 = vfmadd213ps_avx512vl(auVar100,auVar125,auVar99);
          auVar98._8_8_ = uStack_6a0;
          auVar98._0_8_ = local_6a8;
          auVar97._8_8_ = 0x3e4cceac3e4cceac;
          auVar97._0_8_ = 0x3e4cceac3e4cceac;
          auVar125 = vfmadd213ps_avx512vl(auVar98,auVar125,auVar97);
          auVar96._8_8_ = uStack_6a0;
          auVar96._0_8_ = local_6a8;
          auVar95._8_8_ = 0xbe7ffffcbe7ffffc;
          auVar95._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar125 = vfmadd213ps_avx512vl(auVar96,auVar125,auVar95);
          auVar94._8_8_ = uStack_6a0;
          auVar94._0_8_ = local_6a8;
          auVar93._8_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar93._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar125 = vfmadd213ps_avx512vl(auVar94,auVar125,auVar93);
          local_5d8 = auVar125._0_4_;
          fStack_5d4 = auVar125._4_4_;
          fStack_5d0 = auVar125._8_4_;
          fStack_5cc = auVar125._12_4_;
          local_728 = CONCAT44(fStack_5d4 * fStack_634 * fStack_634 * fStack_634,
                               local_5d8 * local_638 * local_638 * local_638);
          uStack_720._0_4_ = fStack_5d0 * fStack_630 * fStack_630 * fStack_630;
          uStack_720._4_4_ = fStack_5cc * fStack_62c * fStack_62c * fStack_62c;
          auVar92._8_8_ = 0xb95e8083b95e8083;
          auVar92._0_8_ = 0xb95e8083b95e8083;
          auVar91._8_8_ = uStack_720;
          auVar91._0_8_ = local_728;
          auVar125 = vfmadd213ps_avx512vl(auVar92,auVar124,auVar91);
          auVar111._4_4_ = fStack_634 * fStack_634;
          auVar111._0_4_ = local_638 * local_638;
          auVar111._12_4_ = fStack_62c * fStack_62c;
          auVar111._8_4_ = fStack_630 * fStack_630;
          auVar110._8_8_ = 0x3f0000003f000000;
          auVar110._0_8_ = 0x3f0000003f000000;
          auVar125 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar125);
          local_668 = auVar125._0_4_;
          fStack_664 = auVar125._4_4_;
          fStack_660 = auVar125._8_4_;
          fStack_65c = auVar125._12_4_;
          local_6a8 = CONCAT44(fStack_634 + fStack_664,local_638 + local_668);
          uStack_6a0._0_4_ = fStack_630 + fStack_660;
          uStack_6a0._4_4_ = fStack_62c + fStack_65c;
          auVar90._8_8_ = 0x3f3180003f318000;
          auVar90._0_8_ = 0x3f3180003f318000;
          auVar89._8_8_ = uStack_6a0;
          auVar89._0_8_ = local_6a8;
          auVar124 = vfmadd213ps_avx512vl(auVar90,auVar124,auVar89);
          auVar126 = vpor_avx(auVar124,auVar126);
          local_ce8 = auVar126._0_4_;
          fStack_ce4 = auVar126._4_4_;
          fStack_ce0 = auVar126._8_4_;
          fStack_cdc = auVar126._12_4_;
          auVar67._4_4_ = fStack_ce4 * 2.0;
          auVar67._0_4_ = local_ce8 * 2.0;
          auVar67._12_4_ = fStack_cdc * 2.0;
          auVar67._8_4_ = fStack_ce0 * 2.0;
          auVar126 = vsubps_avx512vl(auVar123,auVar67);
          in_ZMM16 = ZEXT1664(auVar123);
          auVar66._8_4_ = 0x42b0c0a5;
          auVar66._0_8_ = 0x42b0c0a542b0c0a5;
          auVar66._12_4_ = 0x42b0c0a5;
          auVar126 = vminps_avx(auVar126,auVar66);
          auVar65._8_4_ = 0xc2b0c0a5;
          auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar65._12_4_ = 0xc2b0c0a5;
          auVar125 = vmaxps_avx(auVar126,auVar65);
          local_b58 = auVar125._0_4_;
          fStack_b54 = auVar125._4_4_;
          fStack_b50 = auVar125._8_4_;
          fStack_b4c = auVar125._12_4_;
          fVar127 = local_b58 * 1.442695 + 0.5;
          fVar128 = fStack_b54 * 1.442695 + 0.5;
          fVar129 = fStack_b50 * 1.442695 + 0.5;
          fVar130 = fStack_b4c * 1.442695 + 0.5;
          local_c68 = CONCAT44(fVar128,fVar127);
          uStack_c60._0_4_ = fVar129;
          uStack_c60._4_4_ = fVar130;
          local_c78 = CONCAT44((int)fVar128,(int)fVar127);
          uStack_c70._0_4_ = (int)fVar129;
          uStack_c70._4_4_ = (int)fVar130;
          auVar69._8_8_ = uStack_c70;
          auVar69._0_8_ = local_c78;
          auVar124 = vcvtdq2ps_avx(auVar69);
          auVar70._8_8_ = uStack_c60;
          auVar70._0_8_ = local_c68;
          auVar126 = vcmpps_avx(auVar70,auVar124,1);
          auVar71._8_8_ = 0x3f8000003f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar126 = vpand_avx(auVar126,auVar71);
          auVar126 = vsubps_avx(auVar124,auVar126);
          auVar81._8_8_ = 0x3f3180003f318000;
          auVar81._0_8_ = 0x3f3180003f318000;
          auVar124 = vfnmadd213ps_fma(auVar81,auVar126,auVar125);
          auVar82._8_8_ = 0xb95e8083b95e8083;
          auVar82._0_8_ = 0xb95e8083b95e8083;
          auVar125 = vfnmadd213ps_fma(auVar82,auVar126,auVar124);
          local_b78 = auVar125._0_4_;
          fStack_b74 = auVar125._4_4_;
          fStack_b70 = auVar125._8_4_;
          fStack_b6c = auVar125._12_4_;
          local_c58 = CONCAT44(fStack_b74 * fStack_b74,local_b78 * local_b78);
          uStack_c50._0_4_ = fStack_b70 * fStack_b70;
          uStack_c50._4_4_ = fStack_b6c * fStack_b6c;
          uStack_ca0._0_4_ = 0x39506967;
          local_ca8 = 0x3950696739506967;
          uStack_ca0._4_4_ = 0x39506967;
          auVar78._8_8_ = uStack_ca0;
          auVar78._0_8_ = 0x3950696739506967;
          auVar77._8_8_ = 0x3ab743ce3ab743ce;
          auVar77._0_8_ = 0x3ab743ce3ab743ce;
          auVar124 = vfmadd213ps_fma(auVar125,auVar78,auVar77);
          auVar76._8_8_ = 0x3c0889083c088908;
          auVar76._0_8_ = 0x3c0889083c088908;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar76);
          auVar75._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar75);
          auVar74._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar74._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar74);
          auVar73._8_8_ = 0x3f0000003f000000;
          auVar73._0_8_ = 0x3f0000003f000000;
          auVar124 = vfmadd213ps_fma(auVar125,auVar124,auVar73);
          auVar72._8_8_ = uStack_c50;
          auVar72._0_8_ = local_c58;
          auVar124 = vfmadd213ps_fma(auVar72,auVar124,auVar125);
          local_bd8 = auVar124._0_4_;
          fStack_bd4 = auVar124._4_4_;
          fStack_bd0 = auVar124._8_4_;
          fStack_bcc = auVar124._12_4_;
          local_ae8 = auVar126._0_4_;
          fStack_ae4 = auVar126._4_4_;
          fStack_ae0 = auVar126._8_4_;
          fStack_adc = auVar126._12_4_;
          local_c78 = CONCAT44((int)fStack_ae4,(int)local_ae8);
          uStack_c70._0_4_ = (int)fStack_ae0;
          uStack_c70._4_4_ = (int)fStack_adc;
          auVar80._8_8_ = uStack_c70;
          auVar80._0_8_ = local_c78;
          auVar79._8_8_ = 0x7f0000007f;
          auVar79._0_8_ = 0x7f0000007f;
          auVar126 = vpaddd_avx(auVar80,auVar79);
          auVar126 = vpslld_avx(auVar126,ZEXT416(0x17));
          local_ba8 = auVar126._0_4_;
          fStack_ba4 = auVar126._4_4_;
          fStack_ba0 = auVar126._8_4_;
          fStack_b9c = auVar126._12_4_;
          auVar64._8_8_ = 0x3f8000003f800000;
          auVar64._0_8_ = 0x3f8000003f800000;
          auVar63._4_4_ = (fStack_bd4 + 1.0) * fStack_ba4 + 1.0;
          auVar63._0_4_ = (local_bd8 + 1.0) * local_ba8 + 1.0;
          auVar63._8_4_ = (fStack_bd0 + 1.0) * fStack_ba0 + 1.0;
          auVar63._12_4_ = (fStack_bcc + 1.0) * fStack_b9c + 1.0;
          auVar126 = vdivps_avx(auVar64,auVar63);
          local_d08 = auVar126._0_4_;
          fStack_d04 = auVar126._4_4_;
          fStack_d00 = auVar126._8_4_;
          fStack_cfc = auVar126._12_4_;
          auVar131._0_4_ = local_d08 * 2.0;
          auVar131._4_4_ = fStack_d04 * 2.0;
          auVar131._8_4_ = fStack_d00 * 2.0;
          auVar131._12_4_ = fStack_cfc * 2.0;
          auVar68._8_8_ = 0x3f8000003f800000;
          auVar68._0_8_ = 0x3f8000003f800000;
          auVar126 = vsubps_avx(auVar131,auVar68);
          local_1918 = auVar126._0_4_;
          fStack_1914 = auVar126._4_4_;
          fStack_1910 = auVar126._8_4_;
          fStack_190c = auVar126._12_4_;
          local_1d38._4_4_ = fStack_1954 * fStack_1914;
          local_1d38._0_4_ = local_1958 * local_1918;
          uStack_1d30._0_4_ = fStack_1900 * fStack_1910;
          uStack_1d30._4_4_ = fStack_18fc * fStack_190c;
          break;
        case 6:
          fVar127 = *(float *)*in_stack_00000030;
          fVar128 = *(float *)(*in_stack_00000030 + 4);
          local_1a78 = CONCAT44(fStack_1954 * fVar127 + fVar128,local_1958 * fVar127 + fVar128);
          uStack_1a70._0_4_ = fStack_1900 * fVar127 + fVar128;
          uStack_1a70._4_4_ = fStack_18fc * fVar127 + fVar128;
          auVar26._8_8_ = uStack_1a70;
          auVar26._0_8_ = local_1a78;
          auVar126 = vmaxps_avx(auVar26,ZEXT816(0));
          auVar27._8_8_ = 0x3f8000003f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar126 = vminps_avx(auVar126,auVar27);
          local_1948 = auVar126._0_4_;
          fStack_1944 = auVar126._4_4_;
          fStack_1940 = auVar126._8_4_;
          fStack_193c = auVar126._12_4_;
          local_1d38._4_4_ = fStack_1944 * fStack_1954;
          local_1d38._0_4_ = local_1948 * local_1958;
          uStack_1d30._0_4_ = fStack_1940 * fStack_1900;
          uStack_1d30._4_4_ = fStack_193c * fStack_18fc;
          break;
        default:
          uStack_1d30 = uStack_2670;
          local_1d38 = (undefined1  [8])local_2678;
        }
        *local_25f0 = local_1d38;
        local_25f0[1] = uStack_1d30;
        local_25f0 = local_25f0 + 2;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack16to4_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128 _sum = _mm_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm_loadu_ps(bias_data_ptr + p * 4);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 16;

                            int k = (y * kernel_w + x) * 64;

                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);
                            __m128 _val8 = _mm_broadcast_ss(sptr + 8);
                            __m128 _val9 = _mm_broadcast_ss(sptr + 9);
                            __m128 _vala = _mm_broadcast_ss(sptr + 10);
                            __m128 _valb = _mm_broadcast_ss(sptr + 11);
                            __m128 _valc = _mm_broadcast_ss(sptr + 12);
                            __m128 _vald = _mm_broadcast_ss(sptr + 13);
                            __m128 _vale = _mm_broadcast_ss(sptr + 14);
                            __m128 _valf = _mm_broadcast_ss(sptr + 15);
                            __m128 _w0 = _mm_load_ps(kptr + k);
                            __m128 _w1 = _mm_load_ps(kptr + k + 4);
                            __m128 _w2 = _mm_load_ps(kptr + k + 8);
                            __m128 _w3 = _mm_load_ps(kptr + k + 12);
                            __m128 _w4 = _mm_load_ps(kptr + k + 16);
                            __m128 _w5 = _mm_load_ps(kptr + k + 20);
                            __m128 _w6 = _mm_load_ps(kptr + k + 24);
                            __m128 _w7 = _mm_load_ps(kptr + k + 28);
                            __m128 _w8 = _mm_load_ps(kptr + k + 32);
                            __m128 _w9 = _mm_load_ps(kptr + k + 36);
                            __m128 _wa = _mm_load_ps(kptr + k + 40);
                            __m128 _wb = _mm_load_ps(kptr + k + 44);
                            __m128 _wc = _mm_load_ps(kptr + k + 48);
                            __m128 _wd = _mm_load_ps(kptr + k + 52);
                            __m128 _we = _mm_load_ps(kptr + k + 56);
                            __m128 _wf = _mm_load_ps(kptr + k + 60);
                            _sum = _mm_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm_fmadd_ps(_val3, _w3, _sum);
                            _sum = _mm_fmadd_ps(_val4, _w4, _sum);
                            _sum = _mm_fmadd_ps(_val5, _w5, _sum);
                            _sum = _mm_fmadd_ps(_val6, _w6, _sum);
                            _sum = _mm_fmadd_ps(_val7, _w7, _sum);
                            _sum = _mm_fmadd_ps(_val8, _w8, _sum);
                            _sum = _mm_fmadd_ps(_val9, _w9, _sum);
                            _sum = _mm_fmadd_ps(_vala, _wa, _sum);
                            _sum = _mm_fmadd_ps(_valb, _wb, _sum);
                            _sum = _mm_fmadd_ps(_valc, _wc, _sum);
                            _sum = _mm_fmadd_ps(_vald, _wd, _sum);
                            _sum = _mm_fmadd_ps(_vale, _we, _sum);
                            _sum = _mm_fmadd_ps(_valf, _wf, _sum);
                        }
                    }

                    kptr += maxk * 64;
                }

                _sum = activation_sse(_sum, activation_type, activation_params);

                _mm_storeu_ps(outptr, _sum);
                outptr += 4;
            }
        }
    }
}